

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::_reshapeFrustum(Application *this,int width,int height)

{
  (*glad_glViewport)(0,0,width,height);
  (*glad_glMatrixMode)(0x1701);
  (*glad_glLoadIdentity)();
  (*glad_glFrustum)(-2.5,2.5,(double)(((float)height / (float)width) * -2.5),
                    (double)(((float)height / (float)width) * 2.5),5.0,30.0);
  (*glad_glMatrixMode)(0x1700);
  (*glad_glLoadIdentity)();
  (*glad_glTranslatef)(0.5,0.5,-20.0);
  return;
}

Assistant:

void Application::_reshapeFrustum(int width, int height) {
    GLfloat h = (GLfloat)height / (GLfloat)width;
    GLfloat xmax, znear, zfar;

    znear = 5.0f;
    zfar  = 30.0f;
    xmax  = znear * 0.5f;

    glViewport(0, 0, (GLint) width, (GLint) height);
    glMatrixMode(GL_PROJECTION);
    glLoadIdentity();
    glFrustum(-xmax, xmax, -xmax * h, xmax * h, znear, zfar);
    glMatrixMode(GL_MODELVIEW);
    glLoadIdentity();
    glTranslatef(0.5, 0.5, -20.0);
}